

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispParser.cpp
# Opt level: O3

Expression * __thiscall Shell::LispParser::parse(LispParser *this)

{
  Expression *pEVar1;
  
  pEVar1 = (Expression *)
           Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  pEVar1->tag = LIST;
  (pEVar1->str)._M_dataplus._M_p = (pointer)&(pEVar1->str).field_2;
  *(undefined2 *)&(pEVar1->str).field_2 = 0x3f;
  (pEVar1->str)._M_string_length = 1;
  pEVar1->list = (List<Shell::LispParser::Expression_*> *)0x0;
  parse(this,&pEVar1->list);
  return pEVar1;
}

Assistant:

LispParser::Expression* LispParser::parse()
{
  Expression* result = new Expression(LIST);
  parse(&result->list);
  return result;
}